

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnBrOnExn(TypeChecker *this,Index depth,TypeVector *types)

{
  bool bVar1;
  TypeVector *expected;
  _anonymous_namespace_ *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *in_RCX;
  Type local_88;
  Result local_84;
  string local_80;
  string local_60;
  Enum local_40;
  Enum local_3c;
  Label *local_38;
  Label *label;
  _anonymous_namespace_ *p_Stack_28;
  Result result;
  TypeVector *types_local;
  Index depth_local;
  TypeChecker *this_local;
  
  p_Stack_28 = (_anonymous_namespace_ *)types;
  Type::Type((Type *)&label,ExnRef);
  label._4_4_ = PopAndCheck1Type(this,label._0_4_,"br_on_exn");
  local_3c = (Enum)GetLabel(this,depth,&local_38);
  bVar1 = Failed((Result)local_3c);
  p_Var2 = p_Stack_28;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    expected = Label::br_types(local_38);
    local_40 = (Enum)CheckTypes(this,(TypeVector *)p_Var2,expected);
    bVar1 = Failed((Result)local_40);
    if (bVar1) {
      p_Var2 = (_anonymous_namespace_ *)Label::br_types(local_38);
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_60,p_Var2,(TypeVector *)0x0,in_RCX);
      uVar3 = std::__cxx11::string::c_str();
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_80,p_Stack_28,(TypeVector *)0x0,in_RCX)
      ;
      uVar4 = std::__cxx11::string::c_str();
      PrintError(this,"br_on_exn has inconsistent types: expected %s, got %s",uVar3,uVar4);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      Result::Result(&local_84,Error);
      label._4_4_ = local_84.enum_;
    }
    Type::Type(&local_88,ExnRef);
    PushType(this,local_88);
    this_local._4_4_ = label._4_4_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnBrOnExn(Index depth, const TypeVector& types) {
  Result result = PopAndCheck1Type(Type::ExnRef, "br_on_exn");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  if (Failed(CheckTypes(types, label->br_types()))) {
    PrintError("br_on_exn has inconsistent types: expected %s, got %s",
               TypesToString(label->br_types()).c_str(),
               TypesToString(types).c_str());
    result = Result::Error;
  }
  PushType(Type::ExnRef);
  return result;
}